

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Instr * __thiscall
GlobOpt::AttachBoundsCheckData
          (GlobOpt *this,Instr *instr,Opnd *lowerBound,Opnd *upperBound,int offset)

{
  IntConstOpnd *newDst;
  int offset_local;
  Opnd *upperBound_local;
  Opnd *lowerBound_local;
  Instr *instr_local;
  GlobOpt *this_local;
  
  IR::Instr::SetSrc1(instr,lowerBound);
  IR::Instr::SetSrc2(instr,upperBound);
  if (offset != 0) {
    newDst = IR::IntConstOpnd::New((long)offset,TyInt32,instr->m_func,false);
    IR::Instr::SetDst(instr,&newDst->super_Opnd);
  }
  return instr;
}

Assistant:

IR::Instr*
GlobOpt::AttachBoundsCheckData(IR::Instr* instr, IR::Opnd* lowerBound, IR::Opnd* upperBound, int offset)
{
    instr->SetSrc1(lowerBound);
    instr->SetSrc2(upperBound);
    if (offset != 0)
    {
        instr->SetDst(IR::IntConstOpnd::New(offset, TyInt32, instr->m_func));
    }
    return instr;
}